

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

int __thiscall glcts::MRTCaseGroup::init(MRTCaseGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  MRTCase *pMVar1;
  MRTCaseGroup *this_local;
  
  pMVar1 = (MRTCase *)operator_new(0x80);
  MRTCase::MRTCase(pMVar1,(this->super_TestCaseGroup).m_context,this->m_glslVersion,ARRAY);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  pMVar1 = (MRTCase *)operator_new(0x80);
  MRTCase::MRTCase(pMVar1,(this->super_TestCaseGroup).m_context,this->m_glslVersion,SEPARATE);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pMVar1);
  return extraout_EAX;
}

Assistant:

void init(void)
	{
		addChild(new MRTCase(m_context, m_glslVersion, MRTCase::ARRAY));
		addChild(new MRTCase(m_context, m_glslVersion, MRTCase::SEPARATE));
	}